

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O2

KaxInternalBlock * __thiscall
libmatroska::KaxBlockBlob::operator_cast_to_KaxInternalBlock_(KaxBlockBlob *this)

{
  KaxBlockGroup *Master;
  KaxInternalBlock *pKVar1;
  
  Master = (this->Block).group;
  if (Master == (KaxBlockGroup *)0x0) {
    __assert_fail("Block.group",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0x3ba,
                  "KaxInternalBlock &libmatroska::KaxBlockBlob::operator libmatroska::KaxInternalBlock &()"
                 );
  }
  if (this->bUseSimpleBlock != false) {
    return (KaxInternalBlock *)Master;
  }
  pKVar1 = &libebml::GetChild<libmatroska::KaxBlock>(&Master->super_EbmlMaster)->
            super_KaxInternalBlock;
  return pKVar1;
}

Assistant:

KaxBlockBlob::operator KaxInternalBlock &()
{
  assert(Block.group);
#if MATROSKA_VERSION >= 2
  if (bUseSimpleBlock)
    return *Block.simpleblock;
  else
#endif
    return *Block.group;
}